

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrcmp.cpp
# Opt level: O0

int __thiscall
CVmObjStrComp::getp_match_values
          (CVmObjStrComp *this,vm_obj_id_t param_2,vm_val_t *retval,uint *argc)

{
  int iVar1;
  int32_t intval;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  vm_val_t *in_RDX;
  long *in_RDI;
  char *refstr;
  char *valstr;
  vm_val_t *in_stack_ffffffffffffff88;
  uint *in_stack_ffffffffffffff90;
  vm_val_t *in_stack_ffffffffffffff98;
  
  if ((getp_match_values(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_match_values(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_match_values::desc,2);
    __cxa_guard_release(&getp_match_values(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                     (CVmNativeCodeDesc *)in_stack_ffffffffffffff88);
  if (iVar1 == 0) {
    CVmStack::get(0);
    pcVar2 = vm_val_t::get_as_string(in_stack_ffffffffffffff88);
    CVmStack::get(1);
    pcVar3 = vm_val_t::get_as_string(in_stack_ffffffffffffff88);
    if ((pcVar2 == (char *)0x0) || (pcVar3 == (char *)0x0)) {
      err_throw(0);
    }
    pcVar2 = pcVar2 + 2;
    sVar4 = vmb_get_len((char *)0x337eda);
    sVar5 = vmb_get_len((char *)0x337ef7);
    intval = (**(code **)(*in_RDI + 0x1e0))(in_RDI,pcVar2,sVar4,pcVar3 + 2,sVar5);
    vm_val_t::set_int(in_RDX,intval);
    CVmStack::discard(2);
  }
  return 1;
}

Assistant:

int CVmObjStrComp::getp_match_values(VMG_ vm_obj_id_t /*self*/,
                                     vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(2);
    const char *valstr;
    const char *refstr;

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* retrieve the strings, but leave them on the stack for gc protection */
    valstr = G_stk->get(0)->get_as_string(vmg0_);
    refstr = G_stk->get(1)->get_as_string(vmg0_);

    /* make sure they're valid strings */
    if (valstr == 0 || refstr == 0)
        err_throw(VMERR_BAD_TYPE_BIF);

    /* compare the strings and return the result */
    retval->set_int(match_strings(valstr + VMB_LEN, vmb_get_len(valstr),
                                  refstr + VMB_LEN, vmb_get_len(refstr)));

    /* discard the gc protection */
    G_stk->discard(2);

    /* handled */
    return TRUE;
}